

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::InsertTypeTransitionsAtPriorSuccessors
          (BackwardPass *this,BasicBlock *block,BasicBlock *blockSucc,int symId,
          AddPropertyCacheBucket *data,BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  BasicBlock *block_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *ppFVar4;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  undefined1 local_40 [8];
  Iterator __iter;
  
  pSVar5 = &(block->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  local_40 = (undefined1  [8])pSVar5;
  __iter.list = pSVar5;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    if (pSVar5 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_003e7dbe;
      *puVar3 = 0;
      pSVar5 = __iter.list;
    }
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                   &pSVar5->super_SListNodeBase<Memory::ArenaAllocator>)->
                  super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_40) {
      return;
    }
    ppFVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_40);
    block_00 = (*ppFVar4)->succBlock;
    if (block_00 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x17b2,"(blockFix)","blockFix");
      if (!bVar2) {
LAB_003e7dbe:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (block_00 == blockSucc) {
      return;
    }
    InsertTypeTransitionAtBlock(this,block_00,symId,data,upwardExposedUses);
    pSVar5 = __iter.list;
  } while( true );
}

Assistant:

void
BackwardPass::InsertTypeTransitionsAtPriorSuccessors(
    BasicBlock *block,
    BasicBlock *blockSucc,
    int symId,
    AddPropertyCacheBucket *data,
    BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    // For each successor of block prior to blockSucc, adjust the type.
    FOREACH_SUCCESSOR_BLOCK(blockFix, block)
    {
        if (blockFix == blockSucc)
        {
            return;
        }

        this->InsertTypeTransitionAtBlock(blockFix, symId, data, upwardExposedUses);
    }
    NEXT_SUCCESSOR_BLOCK;
}